

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O0

void __thiscall
fizplex::BaseTestRegularWithReordering_ForwardTransformDVector_Test::TestBody
          (BaseTestRegularWithReordering_ForwardTransformDVector_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  DVector *in_stack_fffffffffffffe78;
  DVector *lhs;
  DVector *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  size_type in_stack_fffffffffffffe90;
  undefined1 *puVar4;
  AssertHelper local_138;
  Message local_130;
  DVector *in_stack_fffffffffffffed8;
  Base *in_stack_fffffffffffffee0;
  DVector local_100;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [24];
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70 [3];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  AssertionResult local_18;
  
  Base::ftran(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Base::ftran(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Base::ftran(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_48 = 0x3fe0ad12073615a2;
  local_58 = 0xbf9cd85689039b0b;
  uStack_50 = 0x3fcea5dbf193d4bb;
  local_40 = &local_58;
  local_38 = 3;
  l._M_array._7_1_ = in_stack_fffffffffffffe8f;
  l._M_array._0_7_ = in_stack_fffffffffffffe88;
  l._M_len = in_stack_fffffffffffffe90;
  DVector::DVector(in_stack_fffffffffffffe80,l);
  testing::internal::EqHelper<false>::Compare<fizplex::DVector,fizplex::DVector>
            ((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (DVector *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  DVector::~DVector((DVector *)0x1c2668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c26e5);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x1c2742);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c279a);
  local_b8 = 0xbfb5a240e6c2b448;
  local_c8 = 0x3fbcd85689039b0b;
  uStack_c0 = 0x3fa5a240e6c2b448;
  local_b0 = &local_c8;
  local_a8 = 3;
  puVar4 = local_a0;
  l_00._M_array._7_1_ = in_stack_fffffffffffffe8f;
  l_00._M_array._0_7_ = in_stack_fffffffffffffe88;
  l_00._M_len = (size_type)puVar4;
  DVector::DVector(in_stack_fffffffffffffe80,l_00);
  testing::internal::EqHelper<false>::Compare<fizplex::DVector,fizplex::DVector>
            ((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (DVector *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  DVector::~DVector((DVector *)0x1c2834);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_d0);
    in_stack_fffffffffffffe80 =
         (DVector *)testing::AssertionResult::failure_message((AssertionResult *)0x1c28c3);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x6f,(char *)in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x1c2920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c2978);
  lhs = &local_100;
  l_01._M_array._7_1_ = uVar2;
  l_01._M_array._0_7_ = in_stack_fffffffffffffe88;
  l_01._M_len = (size_type)puVar4;
  DVector::DVector(in_stack_fffffffffffffe80,l_01);
  testing::internal::EqHelper<false>::Compare<fizplex::DVector,fizplex::DVector>
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffffe88),(char *)in_stack_fffffffffffffe80,lhs
             ,(DVector *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  DVector::~DVector((DVector *)0x1c2a0c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c2a98);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x1c2ae4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c2b33);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, ForwardTransformDVector) {
  b.ftran(dv0);
  b.ftran(dv1);
  b.ftran(dv2);
  EXPECT_EQ(DVector({-2.0 / 71, 17.0 / 71, 37.0 / 71}), dv0);
  EXPECT_EQ(DVector({8.0 / 71, 3.0 / 71, -6.0 / 71}), dv1);
  EXPECT_EQ(DVector({-5.0 / 71, 7.0 / 71, -14.0 / 71}), dv2);
}